

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O3

DWORD vlinec1(void)

{
  lighttable_t *plVar1;
  fixed_t fVar2;
  BYTE *pBVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  BYTE *pBVar7;
  long lVar8;
  
  iVar4 = vlinebits;
  pBVar3 = dc_source;
  fVar2 = dc_iscale;
  plVar1 = dc_colormap;
  lVar8 = (long)dc_pitch;
  pBVar7 = dc_dest;
  uVar5 = dc_texturefrac;
  iVar6 = dc_count;
  do {
    *pBVar7 = plVar1[pBVar3[uVar5 >> ((byte)iVar4 & 0x3f)]];
    uVar5 = uVar5 + fVar2;
    pBVar7 = pBVar7 + lVar8;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return uVar5;
}

Assistant:

DWORD vlinec1 ()
{
	DWORD fracstep = dc_iscale;
	DWORD frac = dc_texturefrac;
	BYTE *colormap = dc_colormap;
	int count = dc_count;
	const BYTE *source = dc_source;
	BYTE *dest = dc_dest;
	int bits = vlinebits;
	int pitch = dc_pitch;

	do
	{
		*dest = colormap[source[frac>>bits]];
		frac += fracstep;
		dest += pitch;
	} while (--count);

	return frac;
}